

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O2

void __thiscall
Occupy::calculate(Occupy *this,int peak_time_stamp,size_t peak_memory,uint64_t origin_time)

{
  element_type *peVar1;
  element_type *peVar2;
  pointer pOVar3;
  bool bVar4;
  shared_ptr<Task> *task;
  pointer psVar5;
  _Base_ptr p_Var6;
  pointer pOVar7;
  long lVar8;
  OperandUsage *usage;
  uint64_t uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  
  this->move = true;
  peVar1 = (this->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pOVar7 = (peVar1->outs).super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = 0;
  do {
    if (pOVar7 == *(pointer *)
                   ((long)&(peVar1->outs).
                           super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
                           super__Vector_impl_data + 8)) {
LAB_0013500b:
      for (psVar5 = (this->re_gen).
                    super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar5 != (this->re_gen).
                    super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; psVar5 = psVar5 + 1) {
        uVar9 = uVar9 + ((psVar5->super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                        duration;
      }
      lVar8 = 0;
      for (p_Var6 = (this->re_gen_ins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(this->re_gen_ins)._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        if ((p_Var6[3]._M_right == (_Base_ptr)0x0) ||
           (*(int *)&p_Var6[3]._M_right[4]._M_left < peak_time_stamp)) {
          bVar4 = Task::contains((this->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,(OperandHandle *)(p_Var6 + 1),true);
          if (!bVar4) {
            lVar8 = lVar8 + **(long **)(p_Var6 + 1);
          }
        }
      }
      peVar1 = (this->use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pOVar3 = (peVar1->ins).super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl
               .super__Vector_impl_data._M_finish;
      for (pOVar7 = (peVar1->ins).super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>.
                    _M_impl.super__Vector_impl_data._M_start; pOVar7 != pOVar3; pOVar7 = pOVar7 + 1)
      {
        bVar4 = Task::contains((this->gen).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,&pOVar7->operand,true);
        if ((bVar4) &&
           ((peVar1 = (pOVar7->prev_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            , peVar1 == (element_type *)0x0 || (peVar1->time_stamp < peak_time_stamp)))) {
          lVar8 = lVar8 - ((pOVar7->operand).super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->size;
        }
      }
      auVar11._8_4_ = (int)(peak_memory >> 0x20);
      auVar11._0_8_ = peak_memory;
      auVar11._12_4_ = 0x45300000;
      dVar10 = (double)lVar8 /
               ((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)peak_memory) - 4503599627370496.0));
      auVar12._8_4_ = (int)(uVar9 >> 0x20);
      auVar12._0_8_ = uVar9;
      auVar12._12_4_ = 0x45300000;
      auVar13._8_4_ = (int)(origin_time >> 0x20);
      auVar13._0_8_ = origin_time;
      auVar13._12_4_ = 0x45300000;
      dVar14 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0)) /
               ((auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)origin_time) - 4503599627370496.0));
      this->score1 = dVar14 * 0.8 + dVar10 * 0.2;
      this->score2 = dVar14 * 0.19999999999999996 + dVar10 * 0.8;
      return;
    }
    peVar2 = (pOVar7->next_use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) &&
       (peVar2->time_stamp <
        ((this->use).super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->time_stamp)) {
      this->move = false;
      uVar9 = peVar1->duration;
      goto LAB_0013500b;
    }
    pOVar7 = pOVar7 + 1;
  } while( true );
}

Assistant:

void calculate(int peak_time_stamp, size_t peak_memory, uint64_t origin_time) {
        // Maybe dead code
        move = true;
        for (auto &usage: gen->outs) {
            if (usage.next_use and usage.next_use->time_stamp < use->time_stamp) {
                move = false;
                break;
            }
        }

        // Time increased
        uint64_t time_increased = move ? 0 : gen->duration;
        for (auto &task: re_gen) {
            time_increased += task->duration;
        }

        // Memory increased
        // Use `signed long long` instead of `size_t`
        long long memory_increased = 0;
        // Prolong dealloc time (memory increased)
        for (auto &usage: re_gen_ins) {
            if ((not usage.last_use or usage.last_use->time_stamp < peak_time_stamp) and (not gen->contains(usage.operand))) {
                memory_increased += usage.operand->size;
            }
        }
        // Re-computation (memory decreased)
        for (auto &usage: use->ins) {
            if (gen->contains(usage.operand) and (not usage.prev_use or usage.prev_use->time_stamp < peak_time_stamp)) {
                memory_increased -= usage.operand->size;
            }
        }

        // Calculate score, lower is better
        score1 = static_cast<double>(memory_increased) / peak_memory * O1_MEMORY_FACTOR;
        score1 += static_cast<double>(time_increased) / origin_time * O1_TIME_FACTOR;
        score2 = static_cast<double>(memory_increased) / peak_memory * O2_MEMORY_FACTOR;
        score2 += static_cast<double>(time_increased) / origin_time * O2_TIME_FACTOR;
    }